

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsEnabledByCapabilityOpenCL_2_0
               (ValidationState_t *_,uint32_t capability)

{
  bool bVar1;
  uint32_t capability_local;
  ValidationState_t *__local;
  
  bVar1 = ValidationState_t::HasCapability(_,CapabilityImageBasic);
  if (bVar1) {
    if ((((capability == 0xe) || (capability == 0x14)) || (capability - 0x2b < 2)) ||
       (capability == 0x2e || capability == 0x2f)) {
      __local._7_1_ = true;
    }
    else {
      __local._7_1_ = false;
    }
  }
  else {
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool IsEnabledByCapabilityOpenCL_2_0(ValidationState_t& _,
                                     uint32_t capability) {
  if (_.HasCapability(spv::Capability::ImageBasic)) {
    switch (spv::Capability(capability)) {
      case spv::Capability::ImageReadWrite:
      case spv::Capability::LiteralSampler:
      case spv::Capability::Sampled1D:
      case spv::Capability::Image1D:
      case spv::Capability::SampledBuffer:
      case spv::Capability::ImageBuffer:
        return true;
      default:
        break;
    }
    return false;
  }
  return false;
}